

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.hpp
# Opt level: O0

void linenoise::refreshMultiLine(linenoiseState *l)

{
  undefined4 __fd;
  int iVar1;
  int ini_pos;
  int iVar2;
  char *buf;
  void *__buf;
  uint uVar3;
  string local_a0 [8];
  string ab;
  int j;
  int fd;
  int old_rows;
  int col;
  int rpos2;
  int rpos;
  int rows;
  int colpos2;
  int colpos;
  int pcolwid;
  char seq [64];
  linenoiseState *l_local;
  
  buf = (char *)std::__cxx11::string::c_str();
  iVar1 = std::__cxx11::string::length();
  ini_pos = unicodeColumnPos(buf,iVar1);
  iVar1 = unicodeColumnPosForMultiLine(l->buf,l->len,l->len,l->cols,ini_pos);
  rpos2 = (ini_pos + iVar1 + l->cols + -1) / l->cols;
  iVar2 = (ini_pos + l->oldcolpos + l->cols) / l->cols;
  iVar1 = l->maxrows;
  ab.field_2._12_4_ = l->ofd;
  std::__cxx11::string::string(local_a0);
  if (l->maxrows < rpos2) {
    l->maxrows = rpos2;
  }
  if (0 < iVar1 - iVar2) {
    snprintf((char *)&colpos,0x40,"\x1b[%dB",(ulong)(uint)(iVar1 - iVar2));
    std::__cxx11::string::operator+=(local_a0,(char *)&colpos);
  }
  for (ab.field_2._8_4_ = 0; (int)ab.field_2._8_4_ < iVar1 + -1;
      ab.field_2._8_4_ = ab.field_2._8_4_ + 1) {
    snprintf((char *)&colpos,0x40,"\r\x1b[0K\x1b[1A");
    std::__cxx11::string::operator+=(local_a0,(char *)&colpos);
  }
  snprintf((char *)&colpos,0x40,"\r\x1b[0K");
  std::__cxx11::string::operator+=(local_a0,(char *)&colpos);
  std::__cxx11::string::operator+=(local_a0,(string *)&l->prompt);
  std::__cxx11::string::append((char *)local_a0,(ulong)l->buf);
  iVar1 = unicodeColumnPosForMultiLine(l->buf,l->len,l->pos,l->cols,ini_pos);
  if (((l->pos != 0) && (l->pos == l->len)) && ((iVar1 + ini_pos) % l->cols == 0)) {
    std::__cxx11::string::operator+=(local_a0,"\n");
    snprintf((char *)&colpos,0x40,"\r");
    std::__cxx11::string::operator+=(local_a0,(char *)&colpos);
    rpos2 = rpos2 + 1;
    if (l->maxrows < rpos2) {
      l->maxrows = rpos2;
    }
  }
  iVar2 = (ini_pos + iVar1 + l->cols) / l->cols;
  if (0 < rpos2 - iVar2) {
    snprintf((char *)&colpos,0x40,"\x1b[%dA",(ulong)(uint)(rpos2 - iVar2));
    std::__cxx11::string::operator+=(local_a0,(char *)&colpos);
  }
  uVar3 = (ini_pos + iVar1) % l->cols;
  if (uVar3 == 0) {
    snprintf((char *)&colpos,0x40,"\r");
  }
  else {
    snprintf((char *)&colpos,0x40,"\r\x1b[%dC",(ulong)uVar3);
  }
  std::__cxx11::string::operator+=(local_a0,(char *)&colpos);
  __fd = ab.field_2._12_4_;
  l->oldcolpos = iVar1;
  __buf = (void *)std::__cxx11::string::c_str();
  iVar1 = std::__cxx11::string::length();
  write(__fd,__buf,(long)iVar1);
  std::__cxx11::string::~string(local_a0);
  return;
}

Assistant:

inline void refreshMultiLine(struct linenoiseState *l) {
    char seq[64];
    int pcolwid = unicodeColumnPos(l->prompt.c_str(), static_cast<int>(l->prompt.length()));
    int colpos = unicodeColumnPosForMultiLine(l->buf, l->len, l->len, l->cols, pcolwid);
    int colpos2; /* cursor column position. */
    int rows = (pcolwid+colpos+l->cols-1)/l->cols; /* rows used by current buf. */
    int rpos = (pcolwid+l->oldcolpos+l->cols)/l->cols; /* cursor relative row. */
    int rpos2; /* rpos after refresh. */
    int col; /* colum position, zero-based. */
    int old_rows = (int)l->maxrows;
    int fd = l->ofd, j;
    std::string ab;

    /* Update maxrows if needed. */
    if (rows > (int)l->maxrows) l->maxrows = rows;

    /* First step: clear all the lines used before. To do so start by
     * going to the last row. */
    if (old_rows-rpos > 0) {
        snprintf(seq,64,"\x1b[%dB", old_rows-rpos);
        ab += seq;
    }

    /* Now for every row clear it, go up. */
    for (j = 0; j < old_rows-1; j++) {
        snprintf(seq,64,"\r\x1b[0K\x1b[1A");
        ab += seq;
    }

    /* Clean the top line. */
    snprintf(seq,64,"\r\x1b[0K");
    ab += seq;

    /* Write the prompt and the current buffer content */
    ab += l->prompt;
    ab.append(l->buf, l->len);

    /* Get text width to cursor position */
    colpos2 = unicodeColumnPosForMultiLine(l->buf, l->len, l->pos, l->cols, pcolwid);

    /* If we are at the very end of the screen with our prompt, we need to
     * emit a newline and move the prompt to the first column. */
    if (l->pos &&
        l->pos == l->len &&
        (colpos2+pcolwid) % l->cols == 0)
    {
        ab += "\n";
        snprintf(seq,64,"\r");
        ab += seq;
        rows++;
        if (rows > (int)l->maxrows) l->maxrows = rows;
    }

    /* Move cursor to right position. */
    rpos2 = (pcolwid+colpos2+l->cols)/l->cols; /* current cursor relative row. */

    /* Go up till we reach the expected positon. */
    if (rows-rpos2 > 0) {
        snprintf(seq,64,"\x1b[%dA", rows-rpos2);
        ab += seq;
    }

    /* Set column. */
    col = (pcolwid + colpos2) % l->cols;
    if (col)
        snprintf(seq,64,"\r\x1b[%dC", col);
    else
        snprintf(seq,64,"\r");
    ab += seq;

    l->oldcolpos = colpos2;

    if (write(fd,ab.c_str(), static_cast<int>(ab.length())) == -1) {} /* Can't recover from write error. */
}